

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::SharedDtor(NetworkUpdateParameters *this)

{
  NetworkUpdateParameters *pNVar1;
  NetworkUpdateParameters *this_local;
  
  pNVar1 = internal_default_instance();
  if ((this != pNVar1) && (this->optimizer_ != (Optimizer *)0x0)) {
    (*(this->optimizer_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pNVar1 = internal_default_instance();
  if ((this != pNVar1) && (this->epochs_ != (Int64Parameter *)0x0)) {
    (*(this->epochs_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pNVar1 = internal_default_instance();
  if ((this != pNVar1) && (this->shuffle_ != (BoolParameter *)0x0)) {
    (*(this->shuffle_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pNVar1 = internal_default_instance();
  if ((this != pNVar1) && (this->seed_ != (Int64Parameter *)0x0)) {
    (*(this->seed_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void NetworkUpdateParameters::SharedDtor() {
  if (this != internal_default_instance()) {
    delete optimizer_;
  }
  if (this != internal_default_instance()) {
    delete epochs_;
  }
  if (this != internal_default_instance()) {
    delete shuffle_;
  }
  if (this != internal_default_instance()) {
    delete seed_;
  }
}